

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O1

Flag __thiscall
Js::ConfigFlagsTable::GetNextChildFlag(ConfigFlagsTable *this,Flag parentFlag,Flag currentChildFlag)

{
  ConfigFlagsTable *pCVar1;
  Flag FVar2;
  uint uVar3;
  ConfigFlagsTable *pCVar4;
  undefined6 in_register_00000012;
  
  uVar3 = 0;
  if (1 < (ushort)(currentChildFlag - InvalidFlag)) {
    uVar3 = (int)CONCAT62(in_register_00000012,currentChildFlag) + 1;
  }
  FVar2 = InvalidFlag;
  if (uVar3 < 0x1d6) {
    pCVar4 = (ConfigFlagsTable *)(ulong)uVar3;
    do {
      pCVar1 = pCVar4;
      if ((&FlagParents)[(long)pCVar4] != parentFlag) {
        pCVar1 = this;
      }
      this = (ConfigFlagsTable *)((ulong)pCVar1 & 0xffffffff);
      FVar2 = (Flag)this;
    } while (((&FlagParents)[(long)pCVar4] != parentFlag) &&
            (pCVar4 = (ConfigFlagsTable *)&pCVar4->MemOpMissingValueValidate, FVar2 = InvalidFlag,
            pCVar4 != (ConfigFlagsTable *)0x1d6));
  }
  return FVar2;
}

Assistant:

Flag
    ConfigFlagsTable::GetNextChildFlag(Flag parentFlag, Flag currentChildFlag)  const
    {
        // start at the current+1
        int startIndex = (int)currentChildFlag + 1;

        // otherwise start from beginning
        if (currentChildFlag == InvalidFlag || currentChildFlag == NoParentFlag)
        {
            // reset the start index
            startIndex = 0;
        }

        for(int i=startIndex; i < FlagCount; i++)
        {
            Flag currentFlag = (Flag)i;
            Flag parentFlagForCurrentFlag = GetParentFlag(currentFlag);

            if(parentFlagForCurrentFlag == parentFlag)
            {
                // found a match
                return currentFlag;
            }
        }

        // no more
        return InvalidFlag;
    }